

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,ElementsConfidentialAddress *confidential_address,
          ConfidentialAssetId *asset,Amount *amount)

{
  Script SStack_68;
  
  ElementsConfidentialAddress::GetLockingScript(&SStack_68,confidential_address);
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&SStack_68);
  Script::~Script(&SStack_68);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_005cc928;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,amount);
  ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)&SStack_68,confidential_address);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,(Pubkey *)&SStack_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&SStack_68);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const ElementsConfidentialAddress &confidential_address,
    const ConfidentialAssetId &asset, const Amount &amount)
    : AbstractTxOut(confidential_address.GetLockingScript()),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(confidential_address.GetConfidentialKey()),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}